

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O0

int print_insn_m68k(bfd_vma memaddr,disassemble_info *info)

{
  int local_5c;
  bfd_byte *buffer;
  private *ppStack_48;
  int val;
  private priv;
  uint arch_mask;
  disassemble_info *info_local;
  bfd_vma memaddr_local;
  
  info->private_data = &stack0xffffffffffffffb8;
  ppStack_48 = &priv;
  priv.the_buffer._16_4_ = memaddr;
  priv._36_4_ = bfd_m68k_mach_to_features((int)info->mach);
  if (priv._36_4_ == 0) {
    buffer._4_4_ = m68k_scan_mask(memaddr,info,0x3ff);
    if (buffer._4_4_ < 1) {
      buffer._4_4_ = m68k_scan_mask(memaddr,info,0x7e400);
    }
  }
  else {
    buffer._4_4_ = m68k_scan_mask(memaddr,info,priv._36_4_);
  }
  if (buffer._4_4_ == 0) {
    (*info->fprintf_func)
              (info->stream,".short %d",
               (ulong)((uint)(byte)priv.max_fetched * 0x100 + (uint)priv.max_fetched._1_1_));
    local_5c = 2;
  }
  else {
    local_5c = buffer._4_4_;
  }
  return local_5c;
}

Assistant:

int
print_insn_m68k (bfd_vma memaddr, disassemble_info *info)
{
  unsigned int arch_mask;
  struct private priv;
  int val;

  bfd_byte *buffer = priv.the_buffer;

  info->private_data = & priv;
  #if 0
  /* Tell objdump to use two bytes per chunk
     and six bytes per line for displaying raw data.  */
  info->bytes_per_chunk = 2;
  info->bytes_per_line = 6;
  info->display_endian = BFD_ENDIAN_BIG;
  #endif
  priv.max_fetched = priv.the_buffer;
  priv.insn_start = memaddr;
#if 0
  info->insn_info_valid = 1;
  info->branch_delay_insns = 0;
  info->data_size = 0;
  info->target = -1; /* 0 is bad then visualize_jumps would think it's a jump to 0x00000000 */
  info->target2 = -1;
#endif

  #if 0
  if (info->disassembler_options)
    {
      parse_disassembler_options (info->disassembler_options);

      /* To avoid repeated parsing of these options, we remove them here.  */
      info->disassembler_options = NULL;
    }
  #endif

  arch_mask = bfd_m68k_mach_to_features (info->mach);
  if (!arch_mask)
    {
      /* First try printing an m680x0 instruction.  Try printing a Coldfire
	 one if that fails.  */
      val = m68k_scan_mask (memaddr, info, m68k_mask);
      if (val <= 0)
	val = m68k_scan_mask (memaddr, info, mcf_mask);
    }
  else
    {
      val = m68k_scan_mask (memaddr, info, arch_mask);
    }

  if (val == 0)
    /* Handle undefined instructions.  */
    // info->fprintf_func (info->stream, ".short 0x%04x", (buffer[0] << 8) + buffer[1]); // DIRK
    info->fprintf_func (info->stream, ".short %d", (buffer[0] << 8) + buffer[1]);

  return val ? val : 2;
}